

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::setTearOffEnabled(QMenu *this,bool b)

{
  long lVar1;
  ushort uVar2;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(byte *)(lVar1 + 0x421) & 2) == 0) == b) {
    uVar2 = 0x201;
    if (!b) {
      hideTearOffMenu(this);
      uVar2 = 1;
    }
    *(ushort *)(lVar1 + 0x420) = uVar2 | (ushort)*(undefined4 *)(lVar1 + 0x420) & 0xfdfe;
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      local_20 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
      QWidget::resize(&this->super_QWidget,&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::setTearOffEnabled(bool b)
{
    Q_D(QMenu);
    if (d->tearoff == b)
        return;
    if (!b)
        hideTearOffMenu();
    d->tearoff = b;

    d->itemsDirty = true;
    if (isVisible())
        resize(sizeHint());
}